

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::resetScaleFactorsByPartition
          (BeagleCPUImpl<float,_1,_0> *this,int cumulativeScalingIndex,int partitionIndex)

{
  int iVar1;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  float *cumulativeBuffer;
  int endPattern;
  int startPattern;
  undefined4 local_4;
  
  if ((*(ulong *)(in_RDI + 0x58) & 0x80) == 0) {
    iVar1 = *(int *)(*(long *)(in_RDI + 0x88) + (long)in_EDX * 4);
    memset((void *)(*(long *)(*(long *)(in_RDI + 0xb8) + (long)in_ESI * 8) + (long)iVar1 * 4),0,
           (long)(*(int *)(*(long *)(in_RDI + 0x88) + (long)(in_EDX + 1) * 4) - iVar1) << 2);
    local_4 = 0;
  }
  else {
    local_4 = -7;
  }
  return local_4;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::resetScaleFactorsByPartition(int cumulativeScalingIndex,
                                                                    int partitionIndex) {

     if (kFlags & BEAGLE_FLAG_SCALING_AUTO) {
        return BEAGLE_ERROR_NO_IMPLEMENTATION;
     } else {
        int startPattern = gPatternPartitionsStartPatterns[partitionIndex];
        int endPattern = gPatternPartitionsStartPatterns[partitionIndex + 1];

        REALTYPE* cumulativeBuffer = gScaleBuffers[cumulativeScalingIndex];

        memset(&cumulativeBuffer[startPattern], 0, sizeof(REALTYPE) * (endPattern - startPattern));
     }
    return BEAGLE_SUCCESS;
}